

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O2

wt_object wt_init(wave_object wave,char *method,int siglength,int J)

{
  wt_object pwVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined4 uVar5;
  int iVar6;
  char *pcVar7;
  wt_object pwVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (100 < J) {
    pcVar7 = "\n The Decomposition Iterations Cannot Exceed 100. Exiting ";
    goto LAB_00102889;
  }
  iVar6 = wave->filtlength;
  uVar3 = wmaxiter(siglength);
  if ((int)uVar3 < J) {
    printf("\n Error - The Signal Can only be iterated %d times using this wavelet. Exiting\n",
           (ulong)uVar3);
    goto LAB_001028a1;
  }
  if (((method == (char *)0x0) || (iVar4 = strcmp(method,"dwt"), iVar4 == 0)) ||
     (iVar4 = strcmp(method,"DWT"), iVar4 == 0)) {
    iVar4 = siglength + (iVar6 + 1) * J * 2;
    pwVar8 = (wt_object)malloc((long)iVar4 * 8 + 0x1f8);
    uVar5 = 0x6d7973;
    goto LAB_0010271d;
  }
  iVar4 = strcmp(method,"swt");
  if ((iVar4 == 0) || (iVar4 = strcmp(method,"SWT"), iVar4 == 0)) {
    iVar4 = testSWTlength(siglength,J);
    if (iVar4 == 0) {
      pcVar7 = "\n For SWT the signal length must be a multiple of 2^J. ";
      goto LAB_00102889;
    }
    iVar4 = (J + 1) * siglength;
    iVar2 = iVar4;
  }
  else {
    pcVar7 = strstr(wave->wname,"haar");
    if (((pcVar7 == (char *)0x0) && (pcVar7 = strstr(wave->wname,"db"), pcVar7 == (char *)0x0)) &&
       ((pcVar7 = strstr(wave->wname,"sym"), pcVar7 == (char *)0x0 &&
        (pcVar7 = strstr(wave->wname,"coif"), pcVar7 == (char *)0x0)))) {
      pcVar7 = "\n MODWT is only implemented for orthogonal wavelet families - db, sym and coif ";
LAB_00102889:
      puts(pcVar7);
LAB_001028a1:
      exit(-1);
    }
    iVar4 = (J + 1) * siglength;
    iVar2 = iVar4 * 2;
  }
  pwVar8 = (wt_object)malloc((long)iVar2 * 8 + 0x1f8);
  uVar5 = 0x726570;
LAB_0010271d:
  pwVar8->outlength = iVar4;
  *(undefined4 *)pwVar8->ext = uVar5;
  pwVar8->wave = wave;
  pwVar8->siglength = siglength;
  pwVar8->modwtsiglength = siglength;
  pwVar8->J = J;
  pwVar8->MaxIter = uVar3;
  strcpy(pwVar8->method,method);
  pwVar8->even = ~siglength & 1;
  pwVar8->cobj = (conv_object)0x0;
  builtin_strncpy(pwVar8->cmethod,"direct",7);
  pwVar8->cfftset = 0;
  pwVar8->lenlength = J + 2;
  pwVar1 = pwVar8 + 1;
  pwVar8->output = (double *)pwVar1;
  iVar4 = strcmp(method,"dwt");
  if ((iVar4 == 0) || (iVar4 = strcmp(method,"DWT"), iVar4 == 0)) {
    uVar3 = siglength + J * (iVar6 + 1) * 2;
    uVar10 = 0;
    uVar9 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar9 = uVar10;
    }
    for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      pcVar7 = pwVar1->method + uVar10 * 8 + -0x10;
      pcVar7[0] = '\0';
      pcVar7[1] = '\0';
      pcVar7[2] = '\0';
      pcVar7[3] = '\0';
      pcVar7[4] = '\0';
      pcVar7[5] = '\0';
      pcVar7[6] = '\0';
      pcVar7[7] = '\0';
    }
    return pwVar8;
  }
  iVar6 = strcmp(method,"swt");
  if ((iVar6 != 0) && (iVar6 = strcmp(method,"SWT"), iVar6 != 0)) {
    iVar6 = strcmp(method,"modwt");
    if ((iVar6 != 0) && (iVar6 = strcmp(method,"MODWT"), iVar6 != 0)) {
      return pwVar8;
    }
    uVar3 = siglength * (J + 1) * 2;
    uVar9 = 0;
    uVar10 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar10 = 0;
    }
    for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
      pcVar7 = pwVar1->method + uVar9 * 8 + -0x10;
      pcVar7[0] = '\0';
      pcVar7[1] = '\0';
      pcVar7[2] = '\0';
      pcVar7[3] = '\0';
      pcVar7[4] = '\0';
      pcVar7[5] = '\0';
      pcVar7[6] = '\0';
      pcVar7[7] = '\0';
    }
    return pwVar8;
  }
  uVar3 = (J + 1) * siglength;
  uVar9 = 0;
  uVar10 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar10 = 0;
  }
  for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
    pcVar7 = pwVar1->method + uVar9 * 8 + -0x10;
    pcVar7[0] = '\0';
    pcVar7[1] = '\0';
    pcVar7[2] = '\0';
    pcVar7[3] = '\0';
    pcVar7[4] = '\0';
    pcVar7[5] = '\0';
    pcVar7[6] = '\0';
    pcVar7[7] = '\0';
  }
  return pwVar8;
}

Assistant:

wt_object wt_init(wave_object wave,const char* method, int siglength,int J) {
	int size,i,MaxIter;
	wt_object obj = NULL;

	size = wave->filtlength;

	if (J > 100) {
		printf("\n The Decomposition Iterations Cannot Exceed 100. Exiting \n");
		exit(-1);
	}

	MaxIter = wmaxiter(siglength);

	if (J > MaxIter) {
		printf("\n Error - The Signal Can only be iterated %d times using this wavelet. Exiting\n",MaxIter);
		exit(-1);
	}

	if (method == NULL) {
		obj = (wt_object)malloc(sizeof(struct wt_set) + sizeof(double)* (siglength +  2 * J * (size+1)));
		obj->outlength = siglength + 2 * J * (size + 1); // Default
		strcpy(obj->ext, "sym"); // Default
	}
	else if (!strcmp(method, "dwt") || !strcmp(method, "DWT")) {
		obj = (wt_object)malloc(sizeof(struct wt_set) + sizeof(double)* (siglength + 2 * J * (size + 1)));
		obj->outlength = siglength + 2 * J * (size + 1); // Default
		strcpy(obj->ext, "sym"); // Default
	}
	else if (!strcmp(method, "swt") || !strcmp(method, "SWT")) {
		if (!testSWTlength(siglength, J)) {
			printf("\n For SWT the signal length must be a multiple of 2^J. \n");
			exit(-1);
		}

		obj = (wt_object)malloc(sizeof(struct wt_set) + sizeof(double)* (siglength * (J + 1)));
		obj->outlength = siglength * (J + 1); // Default
		strcpy(obj->ext, "per"); // Default
	}
	else if (!strcmp(method, "modwt") || !strcmp(method, "MODWT")) {

		if (!strstr(wave->wname,"haar")) {
			if (!strstr(wave->wname,"db")) {
				if (!strstr(wave->wname, "sym")) {
					if (!strstr(wave->wname, "coif")) {
						printf("\n MODWT is only implemented for orthogonal wavelet families - db, sym and coif \n");
						exit(-1);
					}
				}
			}
		}

		obj = (wt_object)malloc(sizeof(struct wt_set) + sizeof(double)* (siglength * 2 * (J + 1)));
		obj->outlength = siglength * (J + 1); // Default
		strcpy(obj->ext, "per"); // Default
	}

	obj->wave = wave;
	obj->siglength = siglength;
	obj->modwtsiglength = siglength;
	obj->J = J;
	obj->MaxIter = MaxIter;
	strcpy(obj->method, method);

	if (siglength % 2 == 0) {
		obj->even = 1;
	}
	else {
		obj->even = 0;
	}

	obj->cobj = NULL;

	strcpy(obj->cmethod, "direct"); // Default
	obj->cfftset = 0;
	obj->lenlength = J + 2;
	obj->output = &obj->params[0];
	if (!strcmp(method, "dwt") || !strcmp(method, "DWT")) {
		for (i = 0; i < siglength + 2 * J * (size + 1); ++i) {
			obj->params[i] = 0.0;
		}
	}
	else if (!strcmp(method, "swt") || !strcmp(method, "SWT")) {
		for (i = 0; i < siglength * (J + 1); ++i) {
			obj->params[i] = 0.0;
		}
	}
	else if (!strcmp(method, "modwt") || !strcmp(method, "MODWT")) {
		for (i = 0; i < siglength * 2 * (J + 1); ++i) {
			obj->params[i] = 0.0;
		}
	}
	//wave_summary(obj->wave);

	return obj;
}